

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void poly_genresult(ssh2_mac *mac,uchar *blk)

{
  ccp_context *ctx;
  uchar *blk_local;
  ssh2_mac *mac_local;
  
  poly1305_finalise((poly1305 *)&mac[-8].binarysink_,blk);
  return;
}

Assistant:

static void poly_genresult(ssh2_mac *mac, unsigned char *blk)
{
    struct ccp_context *ctx = container_of(mac, struct ccp_context, mac_if);
    poly1305_finalise(&ctx->mac, blk);
}